

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

UStringTrieResult __thiscall icu_63::BytesTrie::next(BytesTrie *this,int32_t inByte)

{
  byte *pos_00;
  uint node_00;
  int iVar1;
  UStringTrieResult local_3c;
  int32_t node;
  int32_t length;
  uint8_t *pos;
  int32_t inByte_local;
  BytesTrie *this_local;
  
  pos_00 = this->pos_;
  if (pos_00 == (byte *)0x0) {
    this_local._4_4_ = USTRINGTRIE_NO_MATCH;
  }
  else {
    pos._4_4_ = inByte;
    if (inByte < 0) {
      pos._4_4_ = inByte + 0x100;
    }
    if (this->remainingMatchLength_ < 0) {
      this_local._4_4_ = nextImpl(this,pos_00,pos._4_4_);
    }
    else if (pos._4_4_ == *pos_00) {
      iVar1 = this->remainingMatchLength_ + -1;
      this->remainingMatchLength_ = iVar1;
      this->pos_ = pos_00 + 1;
      if ((iVar1 < 0) && (node_00 = (uint)pos_00[1], 0x1f < node_00)) {
        local_3c = valueResult(node_00);
      }
      else {
        local_3c = USTRINGTRIE_NO_VALUE;
      }
      this_local._4_4_ = local_3c;
    }
    else {
      stop(this);
      this_local._4_4_ = USTRINGTRIE_NO_MATCH;
    }
  }
  return this_local._4_4_;
}

Assistant:

UStringTrieResult
BytesTrie::next(int32_t inByte) {
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    if(inByte<0) {
        inByte+=0x100;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    if(length>=0) {
        // Remaining part of a linear-match node.
        if(inByte==*pos++) {
            remainingMatchLength_=--length;
            pos_=pos;
            int32_t node;
            return (length<0 && (node=*pos)>=kMinValueLead) ?
                    valueResult(node) : USTRINGTRIE_NO_VALUE;
        } else {
            stop();
            return USTRINGTRIE_NO_MATCH;
        }
    }
    return nextImpl(pos, inByte);
}